

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::raytracing_pipeline_is_supported
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  size_type sVar1;
  bool bVar2;
  uint local_84;
  uint local_80;
  uint32_t i_2;
  uint32_t i_1;
  uint local_58;
  byte local_53;
  byte local_52;
  allocator local_51;
  uint32_t i;
  VkPipelineCreateFlagBits2KHR local_30;
  VkPipelineCreateFlagBits2KHR flags;
  VkPipelineCreateFlags2KHR supported_flags;
  VkRayTracingPipelineCreateInfoKHR *info_local;
  Impl *this_local;
  
  flags = 0x6913f8c7;
  supported_flags = (VkPipelineCreateFlags2KHR)info;
  info_local = (VkRayTracingPipelineCreateInfoKHR *)this;
  local_30 = get_effective_flags<VkRayTracingPipelineCreateInfoKHR>(info);
  if ((local_30 & 0xffffffff96ec0738) == 0) {
    if ((this->null_device & 1U) == 0) {
      if (((local_30 & 0x3000) == 0) ||
         ((this->features).ray_tracing_pipeline.rayTraversalPrimitiveCulling != 0)) {
        local_52 = 0;
        local_53 = 0;
        bVar2 = false;
        if ((local_30 & 0x800) != 0) {
          std::allocator<char>::allocator();
          local_52 = 1;
          std::__cxx11::string::string((string *)&i,"VK_KHR_pipeline_library",&local_51);
          local_53 = 1;
          sVar1 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->enabled_extensions,(key_type *)&i);
          bVar2 = sVar1 == 0;
        }
        if ((local_53 & 1) != 0) {
          std::__cxx11::string::~string((string *)&i);
        }
        if ((local_52 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_51);
        }
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else if (((local_30 & 0x20000000) == 0) ||
                ((this->features).descriptor_buffer.descriptorBuffer != 0)) {
          if (((local_30 & 0x100000) == 0) ||
             ((this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur != 0)) {
            if (((local_30 & 0x1000000) == 0) || ((this->features).opacity_micromap.micromap != 0))
            {
              if (((local_30 & 0x48000000) == 0) ||
                 ((this->features).pipeline_protected_access.pipelineProtectedAccess != 0)) {
                if ((this->features).ray_tracing_pipeline.rayTracingPipeline == 0) {
                  this_local._7_1_ = false;
                }
                else if ((this->props).ray_tracing_pipeline.maxRayRecursionDepth <
                         *(uint *)(supported_flags + 0x30)) {
                  this_local._7_1_ = false;
                }
                else {
                  if (*(long *)(supported_flags + 0x48) != 0) {
                    for (local_58 = 0;
                        local_58 < *(uint *)(*(long *)(supported_flags + 0x48) + 0x14);
                        local_58 = local_58 + 1) {
                      if (*(int *)(*(long *)(*(long *)(supported_flags + 0x48) + 0x18) +
                                  (ulong)local_58 * 4) != 0x3ba01578) {
                        return false;
                      }
                    }
                    bVar2 = pnext_chain_is_supported
                                      (this,*(void **)(*(long *)(supported_flags + 0x48) + 8));
                    if (!bVar2) {
                      return false;
                    }
                  }
                  i_2._2_1_ = 0;
                  i_2._1_1_ = 0;
                  if ((*(long *)(supported_flags + 0x38) != 0) ||
                     (bVar2 = false, *(long *)(supported_flags + 0x40) != 0)) {
                    std::allocator<char>::allocator();
                    i_2._2_1_ = 1;
                    std::__cxx11::string::string
                              ((string *)&i_1,"VK_KHR_pipeline_library",
                               (allocator *)((long)&i_2 + 3));
                    i_2._1_1_ = 1;
                    sVar1 = std::
                            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::count(&this->enabled_extensions,(key_type *)&i_1);
                    bVar2 = sVar1 == 0;
                  }
                  if ((i_2._1_1_ & 1) != 0) {
                    std::__cxx11::string::~string((string *)&i_1);
                  }
                  if ((i_2._2_1_ & 1) != 0) {
                    std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 3));
                  }
                  if (bVar2) {
                    this_local._7_1_ = false;
                  }
                  else {
                    for (local_80 = 0; local_80 < *(uint *)(supported_flags + 0x14);
                        local_80 = local_80 + 1) {
                      bVar2 = subgroup_size_control_is_supported
                                        (this,(VkPipelineShaderStageCreateInfo *)
                                              (*(long *)(supported_flags + 0x18) +
                                              (ulong)local_80 * 0x30));
                      if (!bVar2) {
                        return false;
                      }
                      bVar2 = pnext_chain_is_supported
                                        (this,*(void **)(*(long *)(supported_flags + 0x18) +
                                                         (ulong)local_80 * 0x30 + 8));
                      if (!bVar2) {
                        return false;
                      }
                    }
                    if (*(long *)(supported_flags + 0x40) != 0) {
                      if ((this->props).ray_tracing_pipeline.maxRayHitAttributeSize <
                          *(uint *)(*(long *)(supported_flags + 0x40) + 0x14)) {
                        return false;
                      }
                      bVar2 = pnext_chain_is_supported
                                        (this,*(void **)(*(long *)(supported_flags + 0x40) + 8));
                      if (!bVar2) {
                        return false;
                      }
                    }
                    if ((*(long *)(supported_flags + 0x38) == 0) ||
                       (bVar2 = pnext_chain_is_supported
                                          (this,*(void **)(*(long *)(supported_flags + 0x38) + 8)),
                       bVar2)) {
                      for (local_84 = 0; local_84 < *(uint *)(supported_flags + 0x20);
                          local_84 = local_84 + 1) {
                        bVar2 = pnext_chain_is_supported
                                          (this,*(void **)(*(long *)(supported_flags + 0x28) +
                                                           (ulong)local_84 * 0x30 + 8));
                        if (!bVar2) {
                          return false;
                        }
                      }
                      this_local._7_1_ =
                           pnext_chain_is_supported(this,*(void **)(supported_flags + 8));
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::raytracing_pipeline_is_supported(const VkRayTracingPipelineCreateInfoKHR *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkPipelineCreateFlags2KHR supported_flags =
			VK_PIPELINE_CREATE_DISABLE_OPTIMIZATION_BIT |
			VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT |
			VK_PIPELINE_CREATE_DERIVATIVE_BIT |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_ANY_HIT_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_CLOSEST_HIT_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_INTERSECTION_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_NO_NULL_MISS_SHADERS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_SKIP_AABBS_BIT_KHR |
			VK_PIPELINE_CREATE_RAY_TRACING_SKIP_TRIANGLES_BIT_KHR |
			VK_PIPELINE_CREATE_LIBRARY_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_PIPELINE_CREATE_RAY_TRACING_ALLOW_MOTION_BIT_NV |
			VK_PIPELINE_CREATE_RAY_TRACING_OPACITY_MICROMAP_BIT_EXT |
			VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
			VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT;

	auto flags = get_effective_flags(info);

	if ((flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((flags & (VK_PIPELINE_CREATE_RAY_TRACING_SKIP_AABBS_BIT_KHR |
	              VK_PIPELINE_CREATE_RAY_TRACING_SKIP_TRIANGLES_BIT_KHR)) != 0 &&
	    features.ray_tracing_pipeline.rayTraversalPrimitiveCulling == VK_FALSE)
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 &&
	    !enabled_extensions.count(VK_KHR_PIPELINE_LIBRARY_EXTENSION_NAME))
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT) != 0)
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

	if ((flags & VK_PIPELINE_CREATE_RAY_TRACING_ALLOW_MOTION_BIT_NV) != 0 &&
	    features.ray_tracing_motion_blur_nv.rayTracingMotionBlur == VK_FALSE)
		return false;

	if ((flags & VK_PIPELINE_CREATE_RAY_TRACING_OPACITY_MICROMAP_BIT_EXT) != 0 &&
	    features.opacity_micromap.micromap == VK_FALSE)
		return false;

	if ((flags & (VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
	              VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT)) != 0 &&
	    features.pipeline_protected_access.pipelineProtectedAccess == VK_FALSE)
		return false;

	if (features.ray_tracing_pipeline.rayTracingPipeline == VK_FALSE)
		return false;

	if (info->maxPipelineRayRecursionDepth > props.ray_tracing_pipeline.maxRayRecursionDepth)
		return false;

	if (info->pDynamicState)
	{
		for (uint32_t i = 0; i < info->pDynamicState->dynamicStateCount; i++)
			if (info->pDynamicState->pDynamicStates[i] != VK_DYNAMIC_STATE_RAY_TRACING_PIPELINE_STACK_SIZE_KHR)
				return false;
		if (!pnext_chain_is_supported(info->pDynamicState->pNext))
			return false;
	}

	if ((info->pLibraryInfo || info->pLibraryInterface) &&
	    !enabled_extensions.count(VK_KHR_PIPELINE_LIBRARY_EXTENSION_NAME))
		return false;

	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		if (!subgroup_size_control_is_supported(info->pStages[i]))
			return false;
		if (!pnext_chain_is_supported(info->pStages[i].pNext))
			return false;
	}

	if (info->pLibraryInterface)
	{
		if (info->pLibraryInterface->maxPipelineRayHitAttributeSize > props.ray_tracing_pipeline.maxRayHitAttributeSize)
			return false;
		if (!pnext_chain_is_supported(info->pLibraryInterface->pNext))
			return false;
	}

	if (info->pLibraryInfo)
	{
		if (!pnext_chain_is_supported(info->pLibraryInfo->pNext))
			return false;
	}

	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		if (!pnext_chain_is_supported(info->pGroups[i].pNext))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}